

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O1

void mafilter_wt(double *sig,int N,double *weights,int window,double *oup)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *__ptr;
  long lVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  double dVar11;
  
  uVar10 = window - (window >> 0x1f);
  uVar2 = uVar10 & 0xfffffffe;
  if (uVar2 == window) {
    iVar3 = uVar2 + N + -1;
  }
  else {
    uVar10 = (window - (window + -1 >> 0x1f)) - 1;
    iVar3 = (uVar10 & 0xfffffffe) + N;
  }
  uVar10 = (int)uVar10 >> 1;
  __ptr = malloc((long)iVar3 * 8);
  if (0 < (int)uVar10) {
    dVar11 = *sig;
    uVar6 = 0;
    do {
      *(double *)((long)__ptr + uVar6 * 8) = dVar11;
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  iVar8 = N + uVar10;
  if (0 < N) {
    iVar1 = uVar10 + 1;
    if ((int)(uVar10 + 1) < iVar8) {
      iVar1 = iVar8;
    }
    memcpy((void *)((long)__ptr + (long)(int)uVar10 * 8),sig,(ulong)(~uVar10 + iVar1) * 8 + 8);
  }
  if (iVar8 < iVar3) {
    dVar11 = sig[(long)N + -1];
    lVar4 = (long)iVar8;
    do {
      *(double *)((long)__ptr + lVar4 * 8) = dVar11;
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  if (uVar2 == window) {
    if (0 < N) {
      lVar5 = (long)(int)uVar10;
      pvVar7 = __ptr;
      lVar4 = lVar5;
      do {
        dVar11 = 0.0;
        if (lVar4 - lVar5 < lVar4 + lVar5) {
          uVar6 = 0;
          do {
            dVar11 = dVar11 + weights[uVar6] * *(double *)((long)pvVar7 + uVar6 * 8);
            uVar6 = uVar6 + 1;
          } while (uVar10 * 2 != uVar6);
        }
        oup[lVar4 - lVar5] = dVar11;
        lVar4 = lVar4 + 1;
        pvVar7 = (void *)((long)pvVar7 + 8);
      } while (lVar4 < iVar8);
    }
  }
  else if (0 < N) {
    lVar5 = (long)(int)uVar10;
    pvVar7 = __ptr;
    lVar4 = lVar5;
    do {
      dVar11 = 0.0;
      if (lVar4 - lVar5 <= lVar4 + lVar5) {
        lVar9 = 0;
        do {
          dVar11 = dVar11 + weights[lVar9] * *(double *)((long)pvVar7 + lVar9 * 8);
          lVar9 = lVar9 + 1;
        } while ((ulong)(uVar10 * 2) + 1 != lVar9);
      }
      oup[lVar4 - lVar5] = dVar11;
      lVar4 = lVar4 + 1;
      pvVar7 = (void *)((long)pvVar7 + 8);
    } while (lVar4 < iVar8);
  }
  free(__ptr);
  return;
}

Assistant:

void mafilter_wt(double *sig,int N, double *weights, int window,double *oup) {
	int odd,q,N2,i,j,ct;
	double sum;
	double *temp;
	
	/*  Accepts Normalized weights. 
	 *  If the weight is not normalized then normalize it by
	 *  dividing all the weights by the sum of all the weights
	 *  [1,1,1,1,1] normalizes to [1,1,1,1,1] / 5 = [0.2,0.2,0.2,0.2,0.2]
	 */ 
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
		N2 = N + (2 * q);
	} else {
		q = window / 2;
		N2 = N + (2 * q) - 1;
	}
	
	
	temp = (double*) malloc (sizeof(double) * N2);
	
	for (i = 0; i < q; ++i) {
		temp[i] = sig[0];
	}
	
	for (i = q; i < N + q; ++i) {
		temp[i] = sig[i - q];
	}
	
	for (i = N + q; i < N2; ++i) {
		temp[i] = sig[N-1];
	}
	
	if (odd) {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			ct = 0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += weights[ct] * temp[j];
				ct++;
			}
			oup[i-q] = sum;
		}  
	} else {
		for (i = q; i < N+q; ++i) {
			sum = 0.0;
			ct = 0;
			for (j = i - q; j < i + q;j++) {
				sum += weights[ct] * temp[j];
				ct++;
			}
			oup[i-q] = sum;
		}  
	}
	
	
	free(temp);
}